

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

void os_time_ns(time_t *sec,long *ns)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  *sec = lVar1 / 1000000000;
  *ns = lVar1 % 1000000000;
  return;
}

Assistant:

void
os_time_ns( os_time_t* sec, long* ns )
{
    using namespace std::chrono;
    // C++ does not guarantee that the system clock's epoch is the same as
    // the Unix Epoch, but it's the de-facto standard in all compilers.
    const auto now = system_clock::now().time_since_epoch();
    *sec = duration_cast<seconds>(now).count();
    *ns = duration_cast<nanoseconds>(now - seconds(*sec)).count();
}